

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::InsertElementInst>::run
          (TypedDeleter<LLVMBC::InsertElementInst> *this)

{
  TypedDeleter<LLVMBC::InsertElementInst> *this_local;
  
  InsertElementInst::~InsertElementInst(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}